

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexstate.cpp
# Opt level: O0

RegExState * __thiscall RegExState::operator=(RegExState *this,RegExState *other)

{
  RegExState *other_local;
  RegExState *this_local;
  
  std::
  multimap<char,_RegExState_*,_std::less<char>,_std::allocator<std::pair<const_char,_RegExState_*>_>_>
  ::operator=(&this->m_Transition,&other->m_Transition);
  this->m_nStateID = other->m_nStateID;
  std::set<RegExState_*,_std::less<RegExState_*>,_std::allocator<RegExState_*>_>::operator=
            (&this->m_NFAStates,&other->m_NFAStates);
  return this;
}

Assistant:

RegExState& RegExState::operator=(const RegExState& other) { 
	this->m_Transition	= other.m_Transition; 
	this->m_nStateID	= other.m_nStateID;
	this->m_NFAStates	= other.m_NFAStates;
	return *this;
}